

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# op.cc
# Opt level: O3

const_iterator __thiscall PcodeOpBank::end(PcodeOpBank *this,OpCode opc)

{
  long lVar1;
  
  if (opc == CPUI_STORE) {
    lVar1 = 0x60;
  }
  else if (opc == CPUI_CALLOTHER) {
    lVar1 = 0x90;
  }
  else if (opc == CPUI_RETURN) {
    lVar1 = 0x78;
  }
  else {
    lVar1 = 0x48;
  }
  return (_List_node_base *)(&(this->optree)._M_t._M_impl.field_0x0 + lVar1);
}

Assistant:

list<PcodeOp *>::const_iterator PcodeOpBank::end(OpCode opc) const

{
  switch(opc) {
  case CPUI_STORE:
    return storelist.end();
  case CPUI_RETURN:
    return returnlist.end();
  case CPUI_CALLOTHER:
    return useroplist.end();
  default:
    break;
  }
  return alivelist.end();
}